

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall YAML::Emitter::SpaceOrIndentTo(Emitter *this,bool requireSpace,size_t indent)

{
  bool bVar1;
  size_t sVar2;
  ostream_wrapper *out;
  size_t in_RDX;
  byte in_SIL;
  long in_RDI;
  IndentTo *in_stack_ffffffffffffffc8;
  ostream_wrapper *in_stack_ffffffffffffffd0;
  IndentTo local_20;
  size_t local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_18 = in_RDX;
  bVar1 = ostream_wrapper::comment((ostream_wrapper *)(in_RDI + 8));
  if (bVar1) {
    YAML::operator<<(in_stack_ffffffffffffffd0,(char (*) [2])in_stack_ffffffffffffffc8);
  }
  sVar2 = ostream_wrapper::col((ostream_wrapper *)(in_RDI + 8));
  if ((sVar2 != 0) && ((local_9 & 1) != 0)) {
    YAML::operator<<(in_stack_ffffffffffffffd0,(char (*) [2])in_stack_ffffffffffffffc8);
  }
  out = (ostream_wrapper *)(in_RDI + 8);
  IndentTo::IndentTo(&local_20,local_18);
  YAML::operator<<(out,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void Emitter::SpaceOrIndentTo(bool requireSpace, std::size_t indent) {
  if (m_stream.comment())
    m_stream << "\n";
  if (m_stream.col() > 0 && requireSpace)
    m_stream << " ";
  m_stream << IndentTo(indent);
}